

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char sqlite3AffinityType(char *zIn,Column *pCol)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  char cVar4;
  uint uVar5;
  byte bVar6;
  byte *zNum;
  uint uVar7;
  int local_1c;
  
  bVar6 = 0x43;
  uVar5 = 0;
  zNum = (byte *)0x0;
LAB_00166f86:
  do {
    pbVar3 = (byte *)zIn + 1;
    bVar1 = *zIn;
    if ((ulong)bVar1 == 0) {
      if (pCol == (Column *)0x0) {
        return bVar6;
      }
      local_1c = 0;
      iVar2 = 0;
      if (0x42 < bVar6) goto LAB_00167083;
      if (zNum != (byte *)0x0) goto LAB_00167062;
      iVar2 = 4;
      goto LAB_00167083;
    }
    uVar7 = uVar5 << 8;
    uVar5 = ""[bVar1] | uVar7;
    zIn = (char *)pbVar3;
    if (uVar5 == 0x626c6f62) {
      if ((bVar6 == 0x45) || (bVar6 == 0x43)) {
        if (*pbVar3 == 0x28) {
          zNum = pbVar3;
        }
        bVar6 = 0x41;
        goto LAB_00166f86;
      }
    }
    else {
      if (uVar5 == 0x63686172) {
        bVar6 = 0x42;
        zNum = pbVar3;
        goto LAB_00166f86;
      }
      if ((uVar5 == 0x74657874) || (uVar5 == 0x636c6f62)) {
        bVar6 = 0x42;
        goto LAB_00166f86;
      }
    }
    if ((uVar5 == 0x646f7562 || (uVar5 == 0x666c6f61 || uVar5 == 0x7265616c)) && bVar6 == 0x43) {
      bVar6 = 0x45;
      goto LAB_00166f86;
    }
  } while (((uint)""[bVar1] | uVar7 & 0xffffff) != 0x696e74);
  bVar6 = 0x44;
  if (pCol != (Column *)0x0) {
    iVar2 = 0;
LAB_00167083:
    cVar4 = -2;
    if (iVar2 < 0xfe) {
      cVar4 = (char)iVar2;
    }
    pCol->szEst = cVar4 + '\x01';
  }
  return bVar6;
LAB_00167062:
  if ((ulong)*zNum == 0) goto LAB_00167083;
  if (0xfffffffffffffff5 < (ulong)*zNum - 0x3a) {
    sqlite3GetInt32((char *)zNum,&local_1c);
    iVar2 = local_1c / 4;
    goto LAB_00167083;
  }
  zNum = zNum + 1;
  goto LAB_00167062;
}

Assistant:

SQLITE_PRIVATE char sqlite3AffinityType(const char *zIn, Column *pCol){
  u32 h = 0;
  char aff = SQLITE_AFF_NUMERIC;
  const char *zChar = 0;

  assert( zIn!=0 );
  while( zIn[0] ){
    h = (h<<8) + sqlite3UpperToLower[(*zIn)&0xff];
    zIn++;
    if( h==(('c'<<24)+('h'<<16)+('a'<<8)+'r') ){             /* CHAR */
      aff = SQLITE_AFF_TEXT;
      zChar = zIn;
    }else if( h==(('c'<<24)+('l'<<16)+('o'<<8)+'b') ){       /* CLOB */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('t'<<24)+('e'<<16)+('x'<<8)+'t') ){       /* TEXT */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('b'<<24)+('l'<<16)+('o'<<8)+'b')          /* BLOB */
        && (aff==SQLITE_AFF_NUMERIC || aff==SQLITE_AFF_REAL) ){
      aff = SQLITE_AFF_BLOB;
      if( zIn[0]=='(' ) zChar = zIn;
#ifndef SQLITE_OMIT_FLOATING_POINT
    }else if( h==(('r'<<24)+('e'<<16)+('a'<<8)+'l')          /* REAL */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('f'<<24)+('l'<<16)+('o'<<8)+'a')          /* FLOA */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('d'<<24)+('o'<<16)+('u'<<8)+'b')          /* DOUB */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
#endif
    }else if( (h&0x00FFFFFF)==(('i'<<16)+('n'<<8)+'t') ){    /* INT */
      aff = SQLITE_AFF_INTEGER;
      break;
    }
  }

  /* If pCol is not NULL, store an estimate of the field size.  The
  ** estimate is scaled so that the size of an integer is 1.  */
  if( pCol ){
    int v = 0;   /* default size is approx 4 bytes */
    if( aff<SQLITE_AFF_NUMERIC ){
      if( zChar ){
        while( zChar[0] ){
          if( sqlite3Isdigit(zChar[0]) ){
            /* BLOB(k), VARCHAR(k), CHAR(k) -> r=(k/4+1) */
            sqlite3GetInt32(zChar, &v);
            break;
          }
          zChar++;
        }
      }else{
        v = 16;   /* BLOB, TEXT, CLOB -> r=5  (approx 20 bytes)*/
      }
    }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( v>=sqlite3GlobalConfig.szSorterRef ){
      pCol->colFlags |= COLFLAG_SORTERREF;
    }
#endif
    v = v/4 + 1;
    if( v>255 ) v = 255;
    pCol->szEst = v;
  }
  return aff;
}